

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O1

int Ivy_ManRewriteSeq(Ivy_Man_t *p,int fUseZeroCost,int fVerbose)

{
  Dec_Node_t *pDVar1;
  char cVar2;
  short sVar3;
  Dec_Node_t *pDVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Rwt_Man_t *p_00;
  void **ppvVar9;
  Ivy_Obj_t *pIVar10;
  int *piVar11;
  Vec_Ptr_t *pVVar12;
  Dec_Graph_t *pDVar13;
  long lVar14;
  ulong uVar15;
  void *pvVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  Ivy_Obj_t *p0;
  void *pvVar20;
  int *piVar21;
  anon_union_8_2_00c7e208_for_Dec_Node_t__2 aVar22;
  void *pvVar23;
  char *pcVar24;
  anon_union_8_2_00c7e208_for_Dec_Node_t__2 aVar25;
  bool bVar26;
  timespec ts;
  timespec local_100;
  int local_ec;
  int local_e8;
  int local_e4;
  Ivy_Obj_t *local_e0;
  uint local_d4;
  long local_d0;
  Ivy_Cut_t *local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  ulong local_b0;
  long local_a8;
  Dec_Graph_t *local_a0;
  ulong local_98;
  void *local_90;
  Ivy_Obj_t *local_88;
  int local_80;
  uint local_7c;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  Dec_Graph_t *local_58;
  ulong local_50;
  char *local_48;
  Vec_Ptr_t *local_40;
  long local_38;
  
  local_bc = fUseZeroCost;
  local_80 = fVerbose;
  iVar5 = clock_gettime(3,&local_100);
  if (iVar5 < 0) {
    local_78 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_100.tv_nsec),8);
    local_78 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_100.tv_sec * -1000000;
  }
  pVVar12 = p->vObjs;
  if (0 < pVVar12->nSize) {
    lVar17 = 0;
    do {
      pvVar23 = pVVar12->pArray[lVar17];
      if ((pvVar23 != (void *)0x0) && ((*(uint *)((long)pvVar23 + 8) & 0xf) == 4)) {
        *(uint *)((long)pvVar23 + 8) = *(uint *)((long)pvVar23 + 8) | 0x600;
      }
      lVar17 = lVar17 + 1;
      pVVar12 = p->vObjs;
    } while (lVar17 < pVVar12->nSize);
  }
  iVar5 = 0;
  p_00 = Rwt_ManStart(0);
  p->pData = p_00;
  if (p_00 != (Rwt_Man_t *)0x0) {
    if (p->fFanout == 0) {
      Ivy_ManStartFanout(p);
    }
    pVVar12 = p->vObjs;
    local_50 = (ulong)pVVar12->nSize;
    if (0 < (long)local_50) {
      local_88 = &p->Ghost;
      uVar15 = 0;
      do {
        pIVar10 = (Ivy_Obj_t *)pVVar12->pArray[uVar15];
        if ((pIVar10 != (Ivy_Obj_t *)0x0) &&
           (uVar6 = *(uint *)&pIVar10->field_0x8 & 0xf, 0xfffffffd < uVar6 - 7)) {
          if (uVar6 == 7) {
            __assert_fail("!Ivy_ObjIsBuf(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                          ,0x55,"int Ivy_ManRewriteSeq(Ivy_Man_t *, int, int)");
          }
          if ((*(uint *)(((ulong)pIVar10->pFanin0 & 0xfffffffffffffffe) + 8) & 0xf) == 7) {
            __assert_fail("!Ivy_ObjIsBuf(Ivy_ObjFanin0(pNode))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                          ,0x56,"int Ivy_ManRewriteSeq(Ivy_Man_t *, int, int)");
          }
          if ((*(uint *)(((ulong)pIVar10->pFanin1 & 0xfffffffffffffffe) + 8) & 0xf) == 7) {
            __assert_fail("!Ivy_ObjIsBuf(Ivy_ObjFanin1(pNode))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                          ,0x57,"int Ivy_ManRewriteSeq(Ivy_Man_t *, int, int)");
          }
          if (local_50 <= uVar15) break;
          p_00->nNodesConsidered = p_00->nNodesConsidered + 1;
          local_e0 = pIVar10;
          local_b0 = uVar15;
          iVar5 = clock_gettime(3,&local_100);
          if (iVar5 < 0) {
            lVar17 = 1;
          }
          else {
            lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_100.tv_nsec),8);
            lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_100.tv_sec * -1000000;
          }
          Ivy_CutComputeForNode(p,local_e0,5);
          iVar5 = clock_gettime(3,&local_100);
          if (iVar5 < 0) {
            lVar18 = -1;
          }
          else {
            lVar18 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
          }
          p_00->timeCut = p_00->timeCut + lVar18 + lVar17;
          iVar5 = clock_gettime(3,&local_100);
          if (iVar5 < 0) {
            local_70 = 1;
          }
          else {
            lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_100.tv_nsec),8);
            local_70 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_100.tv_sec * -1000000;
          }
          if (Ivy_CutComputeForNode::CutStore.nCuts < 2) {
            iVar5 = -1;
            uVar15 = 0;
          }
          else {
            local_d4 = 0;
            iVar5 = -1;
            lVar17 = 1;
            lVar18 = 0xc5175c;
            local_e8 = -1;
            do {
              if (Ivy_CutComputeForNode::CutStore.pCuts[lVar17].nSize == 4) {
                local_c8 = Ivy_CutComputeForNode::CutStore.pCuts + lVar17;
                piVar11 = Ivy_CutComputeForNode::CutStore.pCuts[lVar17].pArray;
                lVar14 = 0;
                do {
                  uVar6 = *(int *)(lVar18 + lVar14 * 4) >> 8;
                  local_d0 = lVar17;
                  if (((int)uVar6 < 0) || (p->vObjs->nSize <= (int)uVar6)) goto LAB_0075dc88;
                  if ((*(uint *)((long)p->vObjs->pArray[uVar6] + 8) & 0xf) == 7) goto LAB_0075d090;
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 4);
                lVar14 = 4;
LAB_0075d090:
                if ((int)lVar14 == 4) {
                  p_00->nCutsGood = p_00->nCutsGood + 1;
                  local_b8 = iVar5;
                  local_a8 = lVar18;
                  iVar5 = clock_gettime(3,&local_100);
                  if (iVar5 < 0) {
                    lVar17 = 1;
                  }
                  else {
                    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_100.tv_nsec),8);
                    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_100.tv_sec * -1000000;
                  }
                  if ((*(uint *)&local_e0->field_0x8 & 0xf) - 7 < 0xfffffffe) {
                    __assert_fail("Ivy_ObjIsNode(pObj)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                  ,0x25c,
                                  "unsigned int Ivy_CutGetTruth(Ivy_Man_t *, Ivy_Obj_t *, int *, int)"
                                 );
                  }
                  if (5 < local_c8->nSize) {
                    __assert_fail("nNums < 6",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                  ,0x25d,
                                  "unsigned int Ivy_CutGetTruth(Ivy_Man_t *, Ivy_Obj_t *, int *, int)"
                                 );
                  }
                  uVar6 = Ivy_CutGetTruth_rec(p,local_e0->Id << 8,piVar11,(int)local_c8->nSize);
                  iVar5 = clock_gettime(3,&local_100);
                  if (iVar5 < 0) {
                    lVar18 = -1;
                  }
                  else {
                    lVar18 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
                  }
                  p_00->timeTruth = p_00->timeTruth + lVar18 + lVar17;
                  local_98 = (ulong)(uVar6 & 0xffff);
                  pcVar24 = p_00->pPerms4[p_00->pPerms[local_98]];
                  cVar2 = p_00->pPhases[local_98];
                  pVVar12 = p_00->vFaninsCur;
                  pVVar12->nSize = 0;
                  sVar3 = local_c8->nSize;
                  uVar6 = (uint)sVar3;
                  if (pVVar12->nCap < (int)uVar6) {
                    if (pVVar12->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((long)(int)uVar6 << 3);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar12->pArray,(long)(int)uVar6 << 3);
                    }
                    pVVar12->pArray = ppvVar9;
                    pVVar12->nCap = uVar6;
                  }
                  if (0 < sVar3) {
                    uVar15 = 0;
                    do {
                      pVVar12->pArray[uVar15] = (void *)0x0;
                      uVar15 = uVar15 + 1;
                    } while (uVar6 != uVar15);
                  }
                  pVVar12->nSize = uVar6;
                  sVar3 = local_c8->nSize;
                  if (0 < (long)sVar3) {
                    lVar17 = 0;
                    do {
                      uVar6 = piVar11[pcVar24[lVar17]] >> 8;
                      if (((int)uVar6 < 0) || (p->vObjs->nSize <= (int)uVar6)) {
LAB_0075dc88:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                      }
                      piVar21 = (int *)p->vObjs->pArray[uVar6];
                      uVar6 = piVar21[2] & 0xf;
                      if ((((uVar6 - 7 < 0xfffffffe) && (uVar6 != 1)) && (uVar6 != 4)) &&
                         (*piVar21 != 0)) {
                        __assert_fail("Ivy_ObjIsNode(pFanin) || Ivy_ObjIsCi(pFanin) || Ivy_ObjIsConst1(pFanin)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                      ,199,
                                      "int Ivy_NodeRewriteSeq(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, int)"
                                     );
                      }
                      if (p_00->vFaninsCur->nSize <= lVar17) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                      }
                      p_00->vFaninsCur->pArray[lVar17] =
                           (void *)((ulong)piVar21 ^
                                   (ulong)(((uint)(int)cVar2 >> ((uint)lVar17 & 0x1f) & 1) != 0));
                      lVar17 = lVar17 + 1;
                    } while (sVar3 != lVar17);
                  }
                  local_7c = (int)cVar2;
                  iVar5 = clock_gettime(3,&local_100);
                  if (iVar5 < 0) {
                    lVar17 = 1;
                  }
                  else {
                    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_100.tv_nsec),8);
                    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_100.tv_sec * -1000000;
                  }
                  lVar18 = (long)p_00->vFaninsCur->nSize;
                  if (0 < lVar18) {
                    ppvVar9 = p_00->vFaninsCur->pArray;
                    lVar14 = 0;
                    do {
                      piVar11 = (int *)(((ulong)ppvVar9[lVar14] & 0xfffffffffffffffe) + 0xc);
                      *piVar11 = *piVar11 + 1;
                      lVar14 = lVar14 + 1;
                    } while (lVar18 != lVar14);
                  }
                  Ivy_ManIncrementTravId(p);
                  local_b4 = Ivy_ObjMffcLabel(p,local_e0);
                  lVar18 = (long)p_00->vFaninsCur->nSize;
                  if (0 < lVar18) {
                    ppvVar9 = p_00->vFaninsCur->pArray;
                    lVar14 = 0;
                    do {
                      uVar15 = (ulong)ppvVar9[lVar14] & 0xfffffffffffffffe;
                      iVar5 = *(int *)(uVar15 + 0xc);
                      if (iVar5 < 1) {
                        __assert_fail("pObj->nRefs > 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                                      ,0x10a,"void Ivy_ObjRefsDec(Ivy_Obj_t *)");
                      }
                      *(int *)(uVar15 + 0xc) = iVar5 + -1;
                      lVar14 = lVar14 + 1;
                    } while (lVar18 != lVar14);
                  }
                  iVar5 = clock_gettime(3,&local_100);
                  if (iVar5 < 0) {
                    lVar18 = -1;
                  }
                  else {
                    lVar18 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
                  }
                  p_00->timeMffc = p_00->timeMffc + lVar18 + lVar17;
                  iVar5 = clock_gettime(3,&local_100);
                  if (iVar5 < 0) {
                    lVar17 = 1;
                  }
                  else {
                    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_100.tv_nsec),8);
                    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_100.tv_sec * -1000000;
                  }
                  if (p_00->vClasses->nSize <= (int)(uint)p_00->pMap[local_98]) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
                  }
                  local_40 = p_00->vFaninsCur;
                  pvVar23 = p_00->vClasses->pArray[p_00->pMap[local_98]];
                  iVar5 = *(int *)((long)pvVar23 + 4);
                  p_00->nSubgraphs = p_00->nSubgraphs + iVar5;
                  local_68 = lVar17;
                  if (iVar5 < 1) {
                    local_e4 = -1;
                    local_a0 = (Dec_Graph_t *)0x0;
                  }
                  else {
                    local_e4 = -1;
                    lVar17 = 0;
                    local_a0 = (Dec_Graph_t *)0x0;
                    local_90 = pvVar23;
                    local_48 = pcVar24;
                    do {
                      pDVar13 = *(Dec_Graph_t **)
                                 (*(long *)(*(long *)((long)pvVar23 + 8) + lVar17 * 8) + 0x20);
                      Ivy_GraphPrepare(pDVar13,local_c8,local_40,local_48);
                      if (pDVar13->fConst == 0) {
                        local_ec = 0;
                        uVar6 = pDVar13->nLeaves;
                        lVar18 = (long)(int)uVar6;
                        if ((uVar6 <= ((uint)pDVar13->eRoot >> 1 & 0x3fffffff)) &&
                           ((int)uVar6 < pDVar13->nSize)) {
                          local_ec = 0;
                          local_60 = lVar17;
                          local_58 = pDVar13;
                          do {
                            pDVar4 = pDVar13->pNodes;
                            pDVar1 = pDVar4 + lVar18;
                            aVar25 = pDVar4[(uint)pDVar1->eEdge0 >> 1 & 0x3fffffff].field_2;
                            aVar22 = pDVar4[(uint)pDVar1->eEdge1 >> 1 & 0x3fffffff].field_2;
                            bVar26 = aVar25.pFunc != (void *)0x0;
                            local_38 = lVar18;
                            if ((bVar26) && (bVar26 = true, (pDVar1->field_0x12 & 0x3e) != 0)) {
                              uVar6 = 0;
                              do {
                                if ((Ivy_Obj_t *)((ulong)aVar25.pFunc & 0xfffffffffffffffe) ==
                                    (Ivy_Obj_t *)0x0) goto LAB_0075dc69;
                                *(uint *)&(p->Ghost).field_0x8 =
                                     *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 0x604;
                                (p->Ghost).pFanin0 =
                                     (Ivy_Obj_t *)((ulong)aVar25.pFunc & 0xfffffffffffffffe);
                                (p->Ghost).pFanin1 = (Ivy_Obj_t *)0x0;
                                pIVar10 = Ivy_TableLookup(p,local_88);
                                aVar25.pFunc = (void *)((ulong)(aVar25.iFunc & 1) ^ (ulong)pIVar10);
                                if (pIVar10 == (Ivy_Obj_t *)0x0) {
                                  aVar25.pFunc = (void *)0x0;
                                }
                                bVar26 = aVar25.pFunc != (void *)0x0;
                                if (aVar25.pFunc == (void *)0x0) goto LAB_0075d5bc;
                                uVar6 = uVar6 + 1;
                              } while (uVar6 < (*(uint *)&pDVar1->field_0x10 >> 0x11 & 0x1f));
                              bVar26 = true;
                            }
LAB_0075d5bc:
                            bVar19 = aVar22.pFunc != (void *)0x0;
                            if (aVar22.pFunc != (void *)0x0) {
                              bVar19 = true;
                              if ((*(ushort *)&pDVar1->field_0x12 & 0x7c0) != 0) {
                                uVar6 = 0;
                                do {
                                  if ((Ivy_Obj_t *)((ulong)aVar22.pFunc & 0xfffffffffffffffe) ==
                                      (Ivy_Obj_t *)0x0) {
LAB_0075dc69:
                                    __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                                                  ,0x139,
                                                  "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                                 );
                                  }
                                  *(uint *)&(p->Ghost).field_0x8 =
                                       *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 0x604;
                                  (p->Ghost).pFanin0 =
                                       (Ivy_Obj_t *)((ulong)aVar22.pFunc & 0xfffffffffffffffe);
                                  (p->Ghost).pFanin1 = (Ivy_Obj_t *)0x0;
                                  pIVar10 = Ivy_TableLookup(p,local_88);
                                  aVar22.pFunc = (void *)((ulong)(aVar22.iFunc & 1) ^ (ulong)pIVar10
                                                         );
                                  if (pIVar10 == (Ivy_Obj_t *)0x0) {
                                    aVar22.pFunc = (void *)0x0;
                                  }
                                  bVar19 = aVar22.pFunc != (void *)0x0;
                                } while ((aVar22.pFunc != (void *)0x0) &&
                                        (uVar6 = uVar6 + 1, bVar19 = true,
                                        uVar6 < (*(uint *)&pDVar1->field_0x10 >> 0x16 & 0x1f)));
                              }
                            }
                            pDVar13 = local_58;
                            pvVar23 = local_90;
                            if ((bool)(bVar26 & bVar19)) {
                              piVar11 = (int *)((ulong)aVar25.pFunc & 0xfffffffffffffffe);
                              if (((piVar11[2] & 0xfU) == 4) &&
                                 ((*(uint *)(((ulong)aVar22.pFunc & 0xfffffffffffffffe) + 8) & 0xf)
                                  == 4)) {
                                __assert_fail("!Ivy_ObjIsLatch(Ivy_Regular(pAnd0)) || !Ivy_ObjIsLatch(Ivy_Regular(pAnd1))"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                              ,0x1ba,
                                              "int Ivy_GraphToNetworkSeqCountSeq(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int)"
                                             );
                              }
                              pvVar16 = (void *)(ulong)((uint)pDVar1->eEdge0 & 1);
                              p0 = (Ivy_Obj_t *)((ulong)pvVar16 ^ (ulong)aVar25.pFunc);
                              pvVar20 = (void *)(ulong)((uint)pDVar1->eEdge1 & 1);
                              pIVar10 = (Ivy_Obj_t *)((ulong)pvVar20 ^ (ulong)aVar22.pFunc);
                              piVar21 = (int *)((ulong)aVar22.pFunc & 0xfffffffffffffffe);
                              if (((piVar11 == piVar21) || (*piVar11 == 0)) || (*piVar21 == 0)) {
                                pIVar10 = Ivy_And(p,p0,pIVar10);
                                pvVar23 = local_90;
                              }
                              else {
                                *(uint *)&(p->Ghost).field_0x8 =
                                     *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
                                (p->Ghost).pFanin0 = p0;
                                (p->Ghost).pFanin1 = pIVar10;
                                if (pvVar20 != aVar22.pFunc) {
                                  iVar5 = 0;
                                  if (pvVar16 != aVar25.pFunc) {
                                    iVar5 = *piVar11;
                                  }
                                  if (*piVar21 < iVar5) {
                                    (p->Ghost).pFanin0 = pIVar10;
                                    (p->Ghost).pFanin1 = p0;
                                  }
                                }
                                pIVar10 = Ivy_TableLookup(p,local_88);
                              }
                              if (local_e0 != (Ivy_Obj_t *)((ulong)pIVar10 & 0xfffffffffffffffe))
                              goto LAB_0075d751;
LAB_0075d796:
                              local_ec = -1;
                              lVar17 = local_60;
                              break;
                            }
                            pIVar10 = (Ivy_Obj_t *)0x0;
LAB_0075d751:
                            if ((pIVar10 == (Ivy_Obj_t *)0x0) ||
                               (*(int *)(((ulong)pIVar10 & 0xfffffffffffffffe) + 4) == p->nTravIds))
                            {
                              if (local_b4 <= local_ec) goto LAB_0075d796;
                              local_ec = local_ec + 1;
                            }
                            (pDVar1->field_2).pFunc = pIVar10;
                            lVar18 = local_38 + 1;
                            lVar17 = local_60;
                          } while (lVar18 < pDVar13->nSize);
                        }
                      }
                      else {
                        local_ec = 0;
                      }
                      if (local_ec != -1) {
                        iVar5 = local_b4 - local_ec;
                        if (local_b4 < local_ec) {
                          __assert_fail("nNodesSaved >= nNodesAdded",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                        ,0x153,
                                        "Dec_Graph_t *Rwt_CutEvaluateSeq(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, Ivy_Cut_t *, char *, Vec_Ptr_t *, int, int *, unsigned int)"
                                       );
                        }
                        if (local_e4 < iVar5) {
                          local_a0 = pDVar13;
                        }
                        if (local_e4 <= iVar5) {
                          local_e4 = iVar5;
                        }
                      }
                      lVar17 = lVar17 + 1;
                      pcVar24 = local_48;
                    } while (lVar17 < *(int *)((long)pvVar23 + 4));
                  }
                  if (local_e4 != -1) {
                    local_e8 = local_e4;
                  }
                  pDVar13 = (Dec_Graph_t *)0x0;
                  if (local_e4 != -1) {
                    pDVar13 = local_a0;
                  }
                  iVar5 = clock_gettime(3,&local_100);
                  if (iVar5 < 0) {
                    lVar17 = -1;
                  }
                  else {
                    lVar17 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
                  }
                  p_00->timeEval = p_00->timeEval + lVar17 + local_68;
                  lVar17 = local_d0;
                  lVar18 = local_a8;
                  iVar5 = local_b8;
                  if ((pDVar13 != (Dec_Graph_t *)0x0) && (local_b8 < local_e8)) {
                    p_00->pGraph = pDVar13;
                    p_00->pCut = local_c8;
                    p_00->pPerm = pcVar24;
                    p_00->fCompl = local_7c >> 4 & 1;
                    p_00->vFanins->nSize = 0;
                    pVVar12 = p_00->vFaninsCur;
                    if (0 < pVVar12->nSize) {
                      lVar17 = 0;
                      do {
                        pvVar23 = pVVar12->pArray[lVar17];
                        pVVar12 = p_00->vFanins;
                        uVar6 = pVVar12->nCap;
                        if (pVVar12->nSize == uVar6) {
                          if ((int)uVar6 < 0x10) {
                            if (pVVar12->pArray == (void **)0x0) {
                              ppvVar9 = (void **)malloc(0x80);
                            }
                            else {
                              ppvVar9 = (void **)realloc(pVVar12->pArray,0x80);
                            }
                            pVVar12->pArray = ppvVar9;
                            iVar5 = 0x10;
                          }
                          else {
                            iVar5 = uVar6 * 2;
                            if (iVar5 <= (int)uVar6) goto LAB_0075d967;
                            if (pVVar12->pArray == (void **)0x0) {
                              ppvVar9 = (void **)malloc((ulong)uVar6 << 4);
                            }
                            else {
                              ppvVar9 = (void **)realloc(pVVar12->pArray,(ulong)uVar6 << 4);
                            }
                            pVVar12->pArray = ppvVar9;
                          }
                          pVVar12->nCap = iVar5;
                          lVar18 = local_a8;
                        }
LAB_0075d967:
                        iVar5 = pVVar12->nSize;
                        pVVar12->nSize = iVar5 + 1;
                        pVVar12->pArray[iVar5] = pvVar23;
                        lVar17 = lVar17 + 1;
                        pVVar12 = p_00->vFaninsCur;
                      } while (lVar17 < pVVar12->nSize);
                    }
                    local_d4 = (uint)local_98;
                    lVar17 = local_d0;
                    iVar5 = local_e8;
                  }
                }
                else {
                  p_00->nCutsBad = p_00->nCutsBad + 1;
                }
              }
              lVar17 = lVar17 + 1;
              lVar18 = lVar18 + 0x24;
            } while (lVar17 < Ivy_CutComputeForNode::CutStore.nCuts);
            uVar15 = (ulong)local_d4;
          }
          iVar7 = clock_gettime(3,&local_100);
          if (iVar7 < 0) {
            lVar17 = -1;
          }
          else {
            lVar17 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
          }
          p_00->timeRes = p_00->timeRes + lVar17 + local_70;
          if (iVar5 == -1) {
            iVar5 = -1;
          }
          else {
            Ivy_GraphPrepare((Dec_Graph_t *)p_00->pGraph,(Ivy_Cut_t *)p_00->pCut,p_00->vFanins,
                             p_00->pPerm);
            p_00->nScores[p_00->pMap[uVar15]] = p_00->nScores[p_00->pMap[uVar15]] + 1;
            p_00->nNodesGained = p_00->nNodesGained + iVar5;
            if ((local_bc != 0) || (0 < iVar5)) {
              p_00->nNodesRewritten = p_00->nNodesRewritten + 1;
            }
          }
          if ((0 < iVar5) || (uVar15 = local_b0, local_bc != 0 && iVar5 == 0)) {
            pDVar13 = (Dec_Graph_t *)Rwt_ManReadDecs(p_00);
            iVar7 = Rwt_ManReadCompl(p_00);
            iVar8 = clock_gettime(3,&local_100);
            if (iVar8 < 0) {
              lVar17 = 1;
            }
            else {
              lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_100.tv_nsec),8);
              lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_100.tv_sec * -1000000;
            }
            if (iVar7 == 0) {
              Ivy_GraphUpdateNetworkSeq(p,local_e0,pDVar13,iVar5);
            }
            else {
              *(byte *)&pDVar13->eRoot = *(byte *)&pDVar13->eRoot ^ 1;
              Ivy_GraphUpdateNetworkSeq(p,local_e0,pDVar13,iVar5);
              *(byte *)&pDVar13->eRoot = *(byte *)&pDVar13->eRoot ^ 1;
            }
            iVar5 = clock_gettime(3,&local_100);
            if (iVar5 < 0) {
              lVar18 = -1;
            }
            else {
              lVar18 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
            }
            Rwt_ManAddTimeUpdate(p_00,lVar18 + lVar17);
            uVar15 = local_b0;
          }
        }
        uVar15 = uVar15 + 1;
        pVVar12 = p->vObjs;
      } while ((long)uVar15 < (long)pVVar12->nSize);
    }
    iVar5 = clock_gettime(3,&local_100);
    if (iVar5 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
    }
    Rwt_ManAddTimeTotal(p_00,lVar17 + local_78);
    if (local_80 != 0) {
      Rwt_ManPrintStats(p_00);
    }
    Rwt_ManStop(p_00);
    p->pData = (void *)0x0;
    Ivy_ManResetLevels(p);
    iVar7 = Ivy_ManCheck(p);
    iVar5 = 1;
    if (iVar7 == 0) {
      puts("Ivy_ManRewritePre(): The check has failed.");
    }
  }
  return iVar5;
}

Assistant:

int Ivy_ManRewriteSeq( Ivy_Man_t * p, int fUseZeroCost, int fVerbose )
{ 
    Rwt_Man_t * pManRwt;
    Ivy_Obj_t * pNode;
    int i, nNodes, nGain;
    abctime clk, clkStart = Abc_Clock();

    // set the DC latch values
    Ivy_ManForEachLatch( p, pNode, i )
        pNode->Init = IVY_INIT_DC;
    // start the rewriting manager
    pManRwt = Rwt_ManStart( 0 );
    p->pData = pManRwt;
    if ( pManRwt == NULL )
        return 0; 
    // create fanouts
    if ( p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // resynthesize each node once
    nNodes = Ivy_ManObjIdMax(p);
    Ivy_ManForEachNode( p, pNode, i )
    {
        assert( !Ivy_ObjIsBuf(pNode) );
        assert( !Ivy_ObjIsBuf(Ivy_ObjFanin0(pNode)) );
        assert( !Ivy_ObjIsBuf(Ivy_ObjFanin1(pNode)) );
        // fix the fanin buffer problem
//        Ivy_NodeFixBufferFanins( p, pNode );
//        if ( Ivy_ObjIsBuf(pNode) )
//            continue;
        // stop if all nodes have been tried once
        if ( i > nNodes ) 
            break;
        // for each cut, try to resynthesize it
        nGain = Ivy_NodeRewriteSeq( p, pManRwt, pNode, fUseZeroCost );
        if ( nGain > 0 || (nGain == 0 && fUseZeroCost) )
        {
            Dec_Graph_t * pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(pManRwt);
            int fCompl           = Rwt_ManReadCompl(pManRwt);
            // complement the FF if needed
clk = Abc_Clock();
            if ( fCompl ) Dec_GraphComplement( pGraph );
            Ivy_GraphUpdateNetworkSeq( p, pNode, pGraph, nGain );
            if ( fCompl ) Dec_GraphComplement( pGraph );
Rwt_ManAddTimeUpdate( pManRwt, Abc_Clock() - clk );
        }
    }
Rwt_ManAddTimeTotal( pManRwt, Abc_Clock() - clkStart );
    // print stats
    if ( fVerbose )
        Rwt_ManPrintStats( pManRwt );
    // delete the managers
    Rwt_ManStop( pManRwt );
    p->pData = NULL;
    // fix the levels
    Ivy_ManResetLevels( p );
//    if ( Ivy_ManCheckFanoutNums(p) )
//        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    // check
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    return 1;
}